

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O0

void __thiscall
Parse::SMTLIB2::readDefineFun
          (SMTLIB2 *this,string *name,LExprList *iArgs,LExpr *oSort,LExpr *body,TermStack *typeArgs,
          bool recursive)

{
  pair<Kernel::TermList,_Kernel::TermList> val;
  TermList arg2;
  bool bVar1;
  int iVar2;
  uint uVar3;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar4;
  undefined8 uVar5;
  size_t sVar6;
  TermList *pTVar7;
  TermList arg1;
  Inference *pIVar8;
  void *pvVar9;
  long in_RDI;
  Stack<Kernel::TermList> *in_R9;
  pair<Kernel::TermList,_Kernel::TermList> pVar10;
  byte in_stack_00000008;
  FormulaUnit *fu;
  Formula *fla;
  TermList lhs_1;
  uint p_1;
  bool in_stack_000001ef;
  TermStack defArgs;
  uint p;
  TermList lhs;
  Symbol *sym;
  Literal *lit;
  bool isTrueFun;
  uint symbIdx;
  TermList rhs;
  ParseResult res;
  DeclaredSymbol fun;
  TermList arg;
  TermList vSort;
  string vName;
  LispListReader pRdr;
  LExprList *pair;
  LispListReader iaRdr;
  TermList *ta;
  TermList *__end1;
  TermList *__begin1;
  TermStack *__range1;
  TermLookup *lookup;
  TermList rangeSort;
  undefined4 in_stack_fffffffffffff998;
  uint in_stack_fffffffffffff99c;
  TermList in_stack_fffffffffffff9a0;
  SMTLIB2 *in_stack_fffffffffffff9a8;
  Formula *in_stack_fffffffffffff9b0;
  Unit *in_stack_fffffffffffff9b8;
  Term *in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  uint in_stack_fffffffffffff9e4;
  Formula *in_stack_fffffffffffff9e8;
  TermList in_stack_fffffffffffff9f0;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  LExpr *in_stack_fffffffffffffa00;
  undefined1 uVar11;
  SMTLIB2 *in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa48;
  uint uVar12;
  undefined4 in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  string *in_stack_fffffffffffffa58;
  SMTLIB2 *in_stack_fffffffffffffa60;
  TermList in_stack_fffffffffffffa68;
  undefined8 in_stack_fffffffffffffa78;
  Signature *in_stack_fffffffffffffa80;
  FromInput local_4f1;
  Inference local_4f0;
  void *local_4c0;
  Inference *local_4b8;
  uint64_t local_4b0;
  uint64_t local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  uint local_48c;
  uint64_t local_488;
  undefined8 local_480;
  Stack<Kernel::TermList> local_478;
  uint local_454;
  undefined8 local_450;
  Symbol *local_448;
  Unit *local_440;
  undefined1 local_435;
  uint local_434;
  uint64_t local_430;
  DeclaredSymbol local_424;
  undefined1 local_419;
  TermList local_2f8;
  TermList local_2f0 [8];
  uint64_t local_2b0;
  DeclaredSymbol local_2a8;
  pair<unsigned_int,_Parse::SMTLIB2::SymbolType> local_2a0;
  uint64_t local_298;
  undefined1 local_289;
  pair<Kernel::TermList,_Kernel::TermList> local_1a8;
  string local_198 [32];
  uint64_t local_178;
  uint64_t local_170;
  uint64_t local_168;
  string local_160 [40];
  LExprList *local_138;
  uint64_t local_128;
  TermList *local_120;
  TermList *local_118;
  TermList *local_110;
  Stack<Kernel::TermList> *local_108;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_100;
  TermList local_f8;
  undefined1 local_e9;
  byte local_31;
  Stack<Kernel::TermList> *local_30;
  
  local_31 = in_stack_00000008 & 1;
  local_30 = in_R9;
  bVar1 = isAlreadyKnownSymbol
                    (in_stack_fffffffffffff9a8,(string *)in_stack_fffffffffffff9a0._content);
  if (bVar1) {
    local_e9 = 1;
    uVar5 = __cxa_allocate_exception(0x50);
    uVar11 = (undefined1)((ulong)in_stack_fffffffffffffa00 >> 0x38);
    std::operator+((char *)in_stack_fffffffffffff9e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0._content);
    Shell::LispParser::Expression::toString_abi_cxx11_
              ((Expression *)in_stack_fffffffffffffa08,(bool)uVar11);
    std::operator+(in_stack_fffffffffffff9d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0._content);
    Lib::UserErrorException::Exception
              ((UserErrorException *)in_stack_fffffffffffff9a0._content,
               (string *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
    local_e9 = 0;
    __cxa_throw(uVar5,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  local_f8 = parseSort(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  pDVar4 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)Lib::
              DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
              ::operator_new(0xa4ffd0);
  Lib::
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::DHMap(pDVar4);
  local_100 = pDVar4;
  if (readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
      ::argSorts == '\0') {
    iVar2 = __cxa_guard_acquire(&readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
                                 ::argSorts);
    if (iVar2 != 0) {
      Lib::Stack<Kernel::TermList>::Stack
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffff9b0,
                 (size_t)in_stack_fffffffffffff9a8);
      __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&readDefineFun::argSorts,&__dso_handle);
      __cxa_guard_release(&readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
                           ::argSorts);
    }
  }
  Lib::Stack<Kernel::TermList>::reset(&readDefineFun::argSorts);
  if (readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
      ::args == '\0') {
    iVar2 = __cxa_guard_acquire(&readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
                                 ::args);
    if (iVar2 != 0) {
      Lib::Stack<Kernel::TermList>::Stack
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffff9b0,
                 (size_t)in_stack_fffffffffffff9a8);
      __cxa_atexit(Lib::Stack<Kernel::TermList>::~Stack,&readDefineFun::args,&__dso_handle);
      __cxa_guard_release(&readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
                           ::args);
    }
  }
  Lib::Stack<Kernel::TermList>::reset(&readDefineFun::args);
  local_108 = local_30;
  local_110 = Lib::Stack<Kernel::TermList>::begin(local_30);
  local_118 = Lib::Stack<Kernel::TermList>::end(local_108);
  for (; local_110 != local_118; local_110 = local_110 + 1) {
    local_120 = local_110;
    local_128 = local_110->_content;
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)
               CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
               in_stack_fffffffffffff9a0);
  }
  Shell::LispListReader::LispListReader
            ((LispListReader *)in_stack_fffffffffffff9a0._content,
             (LExprList *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
  while( true ) {
    bVar1 = Shell::LispListReader::hasNext((LispListReader *)0xa501e5);
    uVar3 = (uint)((ulong)in_stack_fffffffffffffa78 >> 0x20);
    uVar12 = (uint)((ulong)in_stack_fffffffffffffa48 >> 0x20);
    if (!bVar1) break;
    local_138 = Shell::LispListReader::readList((LispListReader *)0xa501fb);
    Shell::LispListReader::LispListReader
              ((LispListReader *)in_stack_fffffffffffff9a0._content,
               (LExprList *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
    Shell::LispListReader::readAtom_abi_cxx11_
              ((LispListReader *)CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8));
    Shell::LispListReader::readNext((LispListReader *)0xa50242);
    local_168 = (uint64_t)parseSort(in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
    Shell::LispListReader::acceptEOL
              ((LispListReader *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
    *(int *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xa0) + 1;
    local_178 = (uint64_t)
                Kernel::TermList::var
                          (in_stack_fffffffffffff99c,
                           SUB41((uint)in_stack_fffffffffffff998 >> 0x18,0));
    local_170 = local_178;
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)
               CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
               in_stack_fffffffffffff9a0);
    std::__cxx11::string::string(local_198,local_160);
    pVar10 = std::make_pair<Kernel::TermList&,Kernel::TermList&>
                       ((TermList *)in_stack_fffffffffffff9a0._content,
                        (TermList *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
    val.second._content._0_4_ = in_stack_fffffffffffff9d0;
    val.first._content = in_stack_fffffffffffff9c8;
    val.second._content._4_4_ = in_stack_fffffffffffff9d4;
    local_1a8 = pVar10;
    bVar1 = Lib::
            DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
            ::insert((DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)in_stack_fffffffffffff9c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9b8,val);
    std::__cxx11::string::~string(local_198);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_289 = 1;
      uVar5 = __cxa_allocate_exception(0x50);
      uVar11 = (undefined1)((ulong)in_stack_fffffffffffffa00 >> 0x38);
      std::operator+((char *)in_stack_fffffffffffff9e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0._content);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9a0._content);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0._content);
      Shell::LispParser::Expression::toString_abi_cxx11_
                ((Expression *)in_stack_fffffffffffffa08,(bool)uVar11);
      std::operator+(in_stack_fffffffffffff9d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0._content);
      Lib::UserErrorException::Exception
                ((UserErrorException *)in_stack_fffffffffffff9a0._content,
                 (string *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      local_289 = 0;
      __cxa_throw(uVar5,&Lib::UserErrorException::typeinfo,
                  Lib::UserErrorException::~UserErrorException);
    }
    local_298 = local_168;
    Lib::Stack<Kernel::TermList>::push
              ((Stack<Kernel::TermList> *)
               CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
               in_stack_fffffffffffff9a0);
    std::__cxx11::string::~string(local_160);
  }
  Lib::
  Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
  ::push((Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
          *)in_stack_fffffffffffff9a0._content,
         (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
          *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
  uVar11 = (undefined1)((ulong)in_stack_fffffffffffffa00 >> 0x38);
  std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>::
  pair<unsigned_int,_Parse::SMTLIB2::SymbolType,_true>(&local_2a0);
  if ((local_31 & 1) != 0) {
    local_2b0 = local_f8._content;
    Lib::Stack<Kernel::TermList>::size(local_30);
    local_2a8 = declareFunctionOrPredicate
                          (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                           in_stack_fffffffffffffa68,
                           (TermStack *)
                           CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),uVar12);
    std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>::operator=(&local_2a0,&local_2a8);
  }
  parseTermOrFormula((SMTLIB2 *)defArgs._stack,(LExpr *)defArgs._capacity,in_stack_000001ef);
  pDVar4 = Lib::
           Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
           ::pop((Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
                  *)(in_RDI + 0xa8));
  if (pDVar4 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                 *)0x0) {
    Lib::
    DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::~DHMap((DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
              *)in_stack_fffffffffffff9a0._content);
    Lib::
    DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
    ::operator_delete((void *)in_stack_fffffffffffff9a0._content,
                      CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
  }
  Kernel::TermList::TermList(local_2f0);
  local_2f8 = ParseResult::asTerm((ParseResult *)in_stack_fffffffffffff9a8,
                                  in_stack_fffffffffffff9a0._content);
  bVar1 = Kernel::TermList::operator!=(&local_2f8,&local_f8);
  if (!bVar1) {
    if ((local_31 & 1) == 0) {
      local_430 = local_f8._content;
      sVar6 = Lib::Stack<Kernel::TermList>::size(local_30);
      uVar3 = (uint)(sVar6 >> 0x20);
      local_424 = declareFunctionOrPredicate
                            (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58,
                             in_stack_fffffffffffffa68,
                             (TermStack *)
                             CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),uVar12);
      std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>::operator=(&local_2a0,&local_424);
    }
    local_434 = local_2a0.first;
    local_435 = local_2a0.second == FUNCTION;
    if ((bool)local_435) {
      local_448 = Kernel::Signature::getFunction
                            ((Signature *)in_stack_fffffffffffff9a0._content,
                             in_stack_fffffffffffff99c);
      uVar3 = local_434;
      sVar6 = Lib::Stack<Kernel::TermList>::size(&readDefineFun::args);
      pTVar7 = Lib::Stack<Kernel::TermList>::begin(&readDefineFun::args);
      uVar12 = (uint)((ulong)pTVar7 >> 0x20);
      Kernel::Term::create
                ((uint)(sVar6 >> 0x20),(uint)sVar6,
                 (TermList *)CONCAT44(uVar3,in_stack_fffffffffffffa50));
      Kernel::TermList::TermList
                ((TermList *)in_stack_fffffffffffff9a0._content,
                 (Term *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      local_454 = Kernel::Signature::getFnDef
                            ((Signature *)CONCAT44(uVar3,in_stack_fffffffffffffa50),uVar12);
      Lib::Stack<Kernel::TermList>::Stack
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffff9c0,
                 (Stack<Kernel::TermList> *)in_stack_fffffffffffff9b8);
      local_480 = local_450;
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
                 in_stack_fffffffffffff9a0);
      local_488 = local_2f0[0]._content;
      Lib::Stack<Kernel::TermList>::push
                ((Stack<Kernel::TermList> *)
                 CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
                 in_stack_fffffffffffff9a0);
      Lib::Stack<Kernel::TermList>::size(&local_478);
      Lib::Stack<Kernel::TermList>::begin(&local_478);
      local_440 = (Unit *)Kernel::Literal::create
                                    ((uint)(in_stack_fffffffffffff9f0._content >> 0x20),
                                     (uint)in_stack_fffffffffffff9f0._content,
                                     SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0),
                                     (TermList *)
                                     CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
      Lib::Stack<Kernel::TermList>::~Stack
                ((Stack<Kernel::TermList> *)in_stack_fffffffffffff9a0._content);
    }
    else {
      arg1._content =
           (uint64_t)
           Kernel::Signature::getPredicate
                     (in_stack_fffffffffffff9a0._content,in_stack_fffffffffffff99c);
      local_448 = (Symbol *)arg1._content;
      uVar3 = Kernel::Signature::getBoolDef(in_stack_fffffffffffffa80,uVar3);
      local_48c = uVar3;
      in_stack_fffffffffffff9f0._content = (uint64_t)Kernel::AtomicFormula::operator_new(0xa50e43);
      in_stack_fffffffffffff9e4 = local_48c;
      in_stack_fffffffffffff9e8 =
           (Formula *)Lib::Stack<Kernel::TermList>::size(&readDefineFun::args);
      Lib::Stack<Kernel::TermList>::begin(&readDefineFun::args);
      Kernel::Literal::create
                ((uint)(in_stack_fffffffffffff9f0._content >> 0x20),
                 (uint)in_stack_fffffffffffff9f0._content,
                 SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0),
                 (TermList *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
      Kernel::AtomicFormula::AtomicFormula
                ((AtomicFormula *)in_stack_fffffffffffff9a0._content,
                 (Literal *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      in_stack_fffffffffffff9c0 = Kernel::Term::createFormula(in_stack_fffffffffffff9b0);
      Kernel::TermList::TermList
                ((TermList *)in_stack_fffffffffffff9a0._content,
                 (Term *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
      local_4a0 = local_498;
      local_4a8 = local_2f0[0]._content;
      local_4b0 = local_f8._content;
      arg2._content._4_4_ = uVar3;
      arg2._content._0_4_ = in_stack_fffffffffffff9f8;
      in_stack_fffffffffffff9b8 =
           (Unit *)Kernel::Literal::createEquality
                             (SUB81((ulong)in_stack_fffffffffffff9e8 >> 0x38,0),arg1,arg2,
                              in_stack_fffffffffffff9f0);
      local_440 = in_stack_fffffffffffff9b8;
    }
    pIVar8 = (Inference *)Kernel::AtomicFormula::operator_new(0xa50f72);
    Kernel::AtomicFormula::AtomicFormula
              ((AtomicFormula *)in_stack_fffffffffffff9a0._content,
               (Literal *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
    local_4b8 = pIVar8;
    Kernel::Signature::Symbol::markProtected(local_448);
    pvVar9 = Kernel::FormulaUnit::operator_new(0xa50fb3);
    pIVar8 = local_4b8;
    Kernel::FromInput::FromInput(&local_4f1,ASSUMPTION);
    Kernel::Inference::Inference
              (pIVar8,(FromInput *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
    Kernel::FormulaUnit::FormulaUnit
              ((FormulaUnit *)in_stack_fffffffffffff9f0._content,in_stack_fffffffffffff9e8,
               (Inference *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
    Kernel::Inference::~Inference(&local_4f0);
    local_4c0 = pvVar9;
    Lib::List<Kernel::Unit_*>::FIFO::pushBack
              ((FIFO *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
    ParseResult::~ParseResult((ParseResult *)0xa51060);
    return;
  }
  local_419 = 1;
  uVar5 = __cxa_allocate_exception(0x50);
  Shell::LispParser::Expression::toString_abi_cxx11_
            ((Expression *)in_stack_fffffffffffffa08,(bool)uVar11);
  std::operator+(&in_stack_fffffffffffff9a8->_logicSet,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9a0._content);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0._content);
  Shell::LispParser::Expression::toString_abi_cxx11_
            ((Expression *)in_stack_fffffffffffffa08,(bool)uVar11);
  std::operator+(in_stack_fffffffffffff9d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0._content);
  Shell::LispParser::Expression::toString_abi_cxx11_
            ((Expression *)in_stack_fffffffffffffa08,(bool)uVar11);
  std::operator+(in_stack_fffffffffffff9d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9a8,(char *)in_stack_fffffffffffff9a0._content);
  Lib::UserErrorException::Exception
            ((UserErrorException *)in_stack_fffffffffffff9a0._content,
             (string *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
  local_419 = 0;
  __cxa_throw(uVar5,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException)
  ;
}

Assistant:

void SMTLIB2::readDefineFun(const std::string& name, LExprList* iArgs, LExpr* oSort, LExpr* body, const TermStack& typeArgs, bool recursive)
{
  if (isAlreadyKnownSymbol(name)) {
    USER_ERROR_EXPR("Redeclaring function symbol: "+name);
  }

  TermList rangeSort = parseSort(oSort);

  TermLookup* lookup = new TermLookup();

  static TermStack argSorts;
  argSorts.reset();

  static TermStack args;
  args.reset();
  for (const auto& ta : typeArgs) {
    args.push(ta);
  }

  LispListReader iaRdr(iArgs);
  while (iaRdr.hasNext()) {
    LExprList* pair = iaRdr.readList();
    LispListReader pRdr(pair);

    std::string vName = pRdr.readAtom();
    TermList vSort = parseSort(pRdr.readNext());

    pRdr.acceptEOL();

    TermList arg = TermList::var(_nextVar++);
    args.push(arg);

    if (!lookup->insert(vName,make_pair(arg,vSort))) {
      USER_ERROR_EXPR("Multiple occurrence of variable "+vName+" in the definition of function "+name);
    }

    argSorts.push(vSort);
  }

  _scopes.push(lookup);

  DeclaredSymbol fun;
  if (recursive) {
    fun = declareFunctionOrPredicate(name, rangeSort, argSorts, typeArgs.size());
  }

  ParseResult res = parseTermOrFormula(body,false/*isSort*/);

  delete _scopes.pop();

  TermList rhs;
  if (res.asTerm(rhs) != rangeSort) {
    USER_ERROR_EXPR("Defined function body "+body->toString()+" has different sort than declared "+oSort->toString());
  }

  if (!recursive) {
    fun = declareFunctionOrPredicate(name, rangeSort, argSorts, typeArgs.size());
  }

  unsigned symbIdx = fun.first;
  ASS(fun.second != SymbolType::TYPECON);
  bool isTrueFun = fun.second==SymbolType::FUNCTION;

  Literal* lit;
  Signature::Symbol* sym;
  if (isTrueFun) {
    sym = env.signature->getFunction(symbIdx);

    TermList lhs(Term::create(symbIdx,args.size(),args.begin()));
    auto p = env.signature->getFnDef(symbIdx);
    auto defArgs = typeArgs;
    defArgs.push(lhs);
    defArgs.push(rhs);
    lit = Literal::create(p,defArgs.size(),true,defArgs.begin());
  } else {
    sym = env.signature->getPredicate(symbIdx);

    auto p = env.signature->getBoolDef(symbIdx);
    TermList lhs(Term::createFormula(new AtomicFormula(Literal::create(p,args.size(),true,args.begin()))));
    lit = Literal::createEquality(true, lhs, rhs, rangeSort);
  }
  Formula* fla = new AtomicFormula(lit);

  // Mark original symbol protected to avoid
  // erroneous unused symbol elimination later.
  // TODO find a better way to do this
  sym->markProtected();

  FormulaUnit* fu = new FormulaUnit(fla, FromInput(UnitInputType::ASSUMPTION));

  _formulas.pushBack(fu);
}